

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

uint32_t iter_predtest_fwd(uint64_t d,uint64_t g,uint32_t flags)

{
  long lVar1;
  
  if (g != 0) {
    if ((flags & 4) == 0) {
      flags = (uint)((-g & d & g) != 0) << 0x1f | flags | 4;
    }
    lVar1 = 0x3f;
    if (g != 0) {
      for (; g >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    flags = flags & 0xfffffffe |
            (uint)(-1 < (long)(d << (~(byte)lVar1 & 0x3f))) + (uint)((g & d) != 0) * 2;
  }
  return flags;
}

Assistant:

static uint32_t iter_predtest_fwd(uint64_t d, uint64_t g, uint32_t flags)
{
    if (likely(g)) {
        /* Compute N from first D & G.
           Use bit 2 to signal first G bit seen.  */
        if (!(flags & 4)) {
#ifdef _MSC_VER
            flags |= ((d & (g & (0 - g))) != 0) << 31;
#else
            flags |= ((d & (g & -g)) != 0) << 31;
#endif
            flags |= 4;
        }

        /* Accumulate Z from each D & G.  */
        flags |= ((d & g) != 0) << 1;

        /* Compute C from last !(D & G).  Replace previous.  */
        flags = deposit32(flags, 0, 1, (d & pow2floor(g)) == 0);
    }
    return flags;
}